

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O3

ssize_t trompeloeil::reporter<trompeloeil::specialized>::send
                  (int __fd,void *__buf,size_t __n,int __flags)

{
  StringRef names;
  StringRef message;
  size_t sVar1;
  ostream *poVar2;
  ssize_t sVar3;
  undefined4 in_register_0000000c;
  char *__s;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef capturedExpression;
  Capturer capturer0;
  __string_type failure;
  AssertionHandler catchAssertionHandler;
  ostringstream os;
  SourceLineInfo local_248;
  undefined1 local_238 [16];
  undefined1 local_228 [64];
  undefined8 local_1e8;
  char local_1b5;
  long *local_1b0;
  char *local_1a8;
  undefined8 uStack_1a0;
  long local_198 [14];
  ios_base local_128 [264];
  
  __s = (char *)CONCAT44(in_register_0000000c,__flags);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  if (__n != 0) {
    if (__buf == (void *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffda8 + (int)*(undefined8 *)(local_198[0] + -0x18) +
                      0xc0);
    }
    else {
      sVar1 = strlen((char *)__buf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,(char *)__buf,sVar1);
    }
    local_228[0x38] = 0x3a;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,local_228 + 0x38,1);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    local_228[0x38] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_228 + 0x38,1);
  }
  if (__s == (char *)0x0) {
    std::ios::clear((int)&stack0xfffffffffffffda8 + (int)*(undefined8 *)(local_198[0] + -0x18) +
                    0xc0);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar1);
  }
  std::__cxx11::stringbuf::str();
  if (__fd == 0) {
    local_238._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/build_O3/_deps/trompeloeil-src/include/catch2/trompeloeil.hpp"
    ;
    local_238._8_8_ = (pointer)0x2c;
    macroName_01.m_size = 4;
    macroName_01.m_start = "FAIL";
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)(local_228 + 0x38),macroName_01,(SourceLineInfo *)local_238,
               (StringRef)ZEXT816(0x46a36f),Normal);
    local_248.file = (char *)0x0;
    local_248.line = 0;
    Catch::ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_248.line,(char *)local_228._24_8_,local_228._32_8_);
    Catch::ReusableStringStream::str_abi_cxx11_
              ((string *)local_238,(ReusableStringStream *)&local_248);
    message.m_size = local_238._8_8_;
    message.m_start = (char *)local_238._0_8_;
    Catch::AssertionHandler::handleMessage
              ((AssertionHandler *)(local_228 + 0x38),ExplicitFailure,message);
    if ((pointer)local_238._0_8_ != (pointer)local_228) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_228._0_8_ + 1));
    }
    Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_248);
    Catch::AssertionHandler::complete((AssertionHandler *)(local_228 + 0x38));
    if (local_1b5 == '\0') {
      (**(code **)(*local_1b0 + 0xa0))();
    }
  }
  else {
    local_228._56_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/build_O3/_deps/trompeloeil-src/include/catch2/trompeloeil.hpp"
    ;
    local_1e8._0_4_ = 0x35;
    local_1e8._4_4_ = 0;
    local_1a8 = "failure";
    uStack_1a0 = 7;
    names.m_size = 7;
    names.m_start = "failure";
    macroName.m_size = 7;
    macroName.m_start = "CAPTURE";
    Catch::Capturer::Capturer
              ((Capturer *)local_238,macroName,(SourceLineInfo *)(local_228 + 0x38),Info,names);
    Catch::Capturer::captureValues<std::__cxx11::string>
              ((Capturer *)local_238,0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_228 + 0x18));
    local_248.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/build_O3/_deps/trompeloeil-src/include/catch2/trompeloeil.hpp"
    ;
    local_248.line = 0x36;
    macroName_00.m_size = 5;
    macroName_00.m_start = "CHECK";
    capturedExpression.m_size = 0xf;
    capturedExpression.m_start = "failure.empty()";
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)(local_228 + 0x38),macroName_00,&local_248,capturedExpression,
               ContinueOnFailure);
    local_248.file = (char *)CONCAT71(local_248.file._1_7_,local_228._32_8_ == 0);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)(local_228 + 0x38),(ExprLhs<bool> *)&local_248);
    Catch::AssertionHandler::complete((AssertionHandler *)(local_228 + 0x38));
    if (local_1b5 == '\0') {
      (**(code **)(*local_1b0 + 0xa0))();
    }
    Catch::Capturer::~Capturer((Capturer *)local_238);
  }
  if ((undefined1 *)local_228._24_8_ != local_228 + 0x28) {
    operator_delete((void *)local_228._24_8_,local_228._40_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  sVar3 = std::ios_base::~ios_base(local_128);
  return sVar3;
}

Assistant:

inline void reporter<specialized>::send(
    severity s,
    const char* file,
    unsigned long line,
    const char* msg)
  {
    std::ostringstream os;
    if (line) os << file << ':' << line << '\n';
    os << msg;
    auto failure = os.str();
    if (s == severity::fatal)
    {
#ifdef CATCH_CONFIG_PREFIX_ALL
      CATCH_FAIL(failure);
#else
      FAIL(failure);
#endif
    }
    else
    {
#ifdef CATCH_CONFIG_PREFIX_ALL
      CATCH_CAPTURE(failure);
      CATCH_CHECK(failure.empty());
#else
      CAPTURE(failure);
      CHECK(failure.empty());
#endif
    }
  }